

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRasterizationTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles3::Functional::anon_unknown_1::CullingTest::triangleOrder
          (CullingTest *this,Vec4 *v0,Vec4 *v1,Vec4 *v2)

{
  Vec2 s2;
  Vec2 s1;
  Vec2 s0;
  Vector<float,_2> local_38;
  Vector<float,_2> local_30;
  Vector<float,_2> local_28;
  float local_20;
  float local_1c;
  
  local_30.m_data =
       (float  [2])
       (this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode;
  tcu::operator/(&local_30,
                 *(float *)((long)&(this->super_BaseRenderingCase).super_TestCase.super_TestCase.
                                   super_TestNode.m_testCtx + 4));
  local_38.m_data = *(float (*) [2])v0->m_data;
  tcu::operator/(&local_38,v0->m_data[3]);
  local_28.m_data = *(float (*) [2])v1->m_data;
  tcu::operator/(&local_28,v1->m_data[3]);
  return (local_38.m_data[1] - local_1c) * (local_30.m_data[0] - local_20) -
         (local_30.m_data[1] - local_1c) * (local_38.m_data[0] - local_20) < 0.0;
}

Assistant:

bool CullingTest::triangleOrder (const tcu::Vec4& v0, const tcu::Vec4& v1, const tcu::Vec4& v2) const
{
	const tcu::Vec2 s0 = v0.swizzle(0, 1) / v0.w();
	const tcu::Vec2 s1 = v1.swizzle(0, 1) / v1.w();
	const tcu::Vec2 s2 = v2.swizzle(0, 1) / v2.w();

	// cross
	return ((s1.x() - s0.x()) * (s2.y() - s0.y()) - (s2.x() - s0.x()) * (s1.y() - s0.y())) < 0;
}